

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_Record_R_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Set_Record_R_PDU::Decode(Set_Record_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  RecordSet local_90;
  uint local_5c;
  undefined1 local_55;
  KUINT32 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Set_Record_R_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x28) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::clear
            (&this->m_vRecs);
  Simulation_Management_Header::Decode
            (&this->super_Simulation_Management_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = KDataStream::operator>>(pKStack_18,&this->m_ui32RqId);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Reliability_Header).m_ui8ReqRelSrv);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding1);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32Padding);
  KDataStream::operator>>(pKVar2,&this->m_ui32NumRecSets);
  for (local_5c = 0; local_5c < this->m_ui32NumRecSets; local_5c = local_5c + 1) {
    DATA_TYPE::RecordSet::RecordSet(&local_90,pKStack_18);
    std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::push_back
              (&this->m_vRecs,&local_90);
    DATA_TYPE::RecordSet::~RecordSet(&local_90);
  }
  return;
}

Assistant:

void Set_Record_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SET_RECORD_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vRecs.clear();

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32RqId
           >> m_ui8ReqRelSrv
           >> m_ui8Padding1
           >> m_ui16Padding
           >> m_ui32Padding
           >> m_ui32NumRecSets;

    for( KUINT32 i = 0; i < m_ui32NumRecSets; ++i )
    {
        m_vRecs.push_back( RecordSet( stream ) );
    }
}